

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O0

void __thiscall t_xml_generator::write_type(t_xml_generator *this,t_type *ttype)

{
  bool bVar1;
  t_program *this_00;
  string *psVar2;
  string *psVar3;
  allocator local_1d9;
  string local_1d8;
  t_type *local_1b8;
  t_type *vtype;
  string local_1a8;
  t_type *local_188;
  t_type *ktype;
  string local_178;
  t_type *local_158;
  t_type *etype_1;
  string local_148;
  t_type *local_128;
  t_type *etype;
  allocator local_f9;
  string local_f8;
  string local_d8;
  allocator local_b1;
  string local_b0;
  string local_90;
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  string type;
  t_type *ttype_local;
  t_xml_generator *this_local;
  
  type.field_2._8_8_ = ttype;
  get_type_name_abi_cxx11_((string *)local_38,this,ttype);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"type",&local_59);
  std::__cxx11::string::string((string *)&local_90,(string *)local_38);
  write_attribute(this,&local_58,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"id");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b0,"type-module",&local_b1);
    this_00 = t_type::get_program((t_type *)type.field_2._8_8_);
    psVar2 = t_program::get_name_abi_cxx11_(this_00);
    std::__cxx11::string::string((string *)&local_d8,(string *)psVar2);
    write_attribute(this,&local_b0,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f8,"type-id",&local_f9);
    psVar3 = (string *)(**(code **)(*(long *)type.field_2._8_8_ + 0x18))();
    std::__cxx11::string::string((string *)&etype,psVar3);
    write_attribute(this,&local_f8,(string *)&etype);
    std::__cxx11::string::~string((string *)&etype);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"list");
    if (bVar1) {
      local_128 = t_list::get_elem_type((t_list *)type.field_2._8_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_148,"elemType",(allocator *)((long)&etype_1 + 7));
      write_element_start(this,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator((allocator<char> *)((long)&etype_1 + 7));
      write_type(this,local_128);
      write_element_end(this);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"set");
      if (bVar1) {
        local_158 = t_set::get_elem_type((t_set *)type.field_2._8_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_178,"elemType",(allocator *)((long)&ktype + 7));
        write_element_start(this,&local_178);
        std::__cxx11::string::~string((string *)&local_178);
        std::allocator<char>::~allocator((allocator<char> *)((long)&ktype + 7));
        write_type(this,local_158);
        write_element_end(this);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"map");
        if (bVar1) {
          local_188 = t_map::get_key_type((t_map *)type.field_2._8_8_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_1a8,"keyType",(allocator *)((long)&vtype + 7));
          write_element_start(this,&local_1a8);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&vtype + 7));
          write_type(this,local_188);
          write_element_end(this);
          local_1b8 = t_map::get_val_type((t_map *)type.field_2._8_8_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1d8,"valueType",&local_1d9);
          write_element_start(this,&local_1d8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
          write_type(this,local_1b8);
          write_element_end(this);
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void t_xml_generator::write_type(t_type* ttype) {
  const string type = get_type_name(ttype);
  write_attribute("type", type);
  if (type == "id") {
    write_attribute("type-module", ttype->get_program()->get_name());
    write_attribute("type-id", ttype->get_name());
  } else if (type == "list") {
    t_type* etype = ((t_list*)ttype)->get_elem_type();
    write_element_start("elemType");
    write_type(etype);
    write_element_end();
  } else if (type == "set") {
    t_type* etype = ((t_set*)ttype)->get_elem_type();
    write_element_start("elemType");
    write_type(etype);
    write_element_end();
  } else if (type == "map") {
    t_type* ktype = ((t_map*)ttype)->get_key_type();
    write_element_start("keyType");
    write_type(ktype);
    write_element_end();
    t_type* vtype = ((t_map*)ttype)->get_val_type();
    write_element_start("valueType");
    write_type(vtype);
    write_element_end();
  }
}